

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::AssignOp::~AssignOp(AssignOp *this)

{
  AssignOp *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_0025aa30;
  if (this->m_lvalueExpr != (Expression *)0x0) {
    (*this->m_lvalueExpr->_vptr_Expression[1])();
  }
  if (this->m_rvalueExpr != (Expression *)0x0) {
    (*this->m_rvalueExpr->_vptr_Expression[1])();
  }
  ValueStorage<64>::~ValueStorage(&this->m_value);
  ValueRange::~ValueRange(&this->m_valueRange);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

AssignOp::~AssignOp (void)
{
	delete m_lvalueExpr;
	delete m_rvalueExpr;
}